

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

void __thiscall
Js::ArrayBuffer::ArrayBuffer
          (ArrayBuffer *this,byte *buffer,uint32 length,DynamicType *type,bool isExternal)

{
  bool bVar1;
  Recycler *this_00;
  HeapAllocator *alloc;
  Type pRVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  DynamicObject::DynamicObject((DynamicObject *)this,type,true);
  (this->super_ArrayBufferBase).isDetached = false;
  (this->super_ArrayBufferBase).externalized = false;
  (this->super_ArrayBufferBase).infoBits = '\0';
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01505ca8;
  (this->primaryParent).ptr = (RecyclerWeakReference<Js::ArrayBufferParent> *)0x0;
  (this->otherParents).ptr = (OtherParents *)0x0;
  this->bufferContent = (Type)0x0;
  this->bufferLength = length;
  if ((int)length < 0) {
    JavascriptError::ThrowTypeError
              ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr
                  )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
               -0x7ff5ec37,(PCWSTR)0x0);
  }
  if (!isExternal) {
    this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)length);
    if (!bVar1) {
      JavascriptError::ThrowOutOfMemoryError
                ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.
                    ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    }
  }
  if (buffer != (byte *)0x0) {
    local_50 = (undefined1  [8])&RefCountedBuffer::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_5dbadfc;
    data.filename._0_4_ = 0x2e4;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    pRVar2 = (Type)new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
    pRVar2->buffer = buffer;
    pRVar2->refCount = 1;
    this->bufferContent = pRVar2;
  }
  return;
}

Assistant:

ArrayBuffer::ArrayBuffer(byte* buffer, uint32 length, DynamicType * type, bool isExternal) :
        bufferContent(nullptr), bufferLength(length), ArrayBufferBase(type)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        if (!isExternal)
        {
            // we take the ownership of the buffer and will have to free it so charge it to our quota.
            if (!this->GetRecycler()->RequestExternalMemoryAllocation(length))
            {
                JavascriptError::ThrowOutOfMemoryError(this->GetScriptContext());
            }
        }

        if (buffer != nullptr)
        {
            RefCountedBuffer* localContent = HeapNew(RefCountedBuffer, buffer);
            this->bufferContent = localContent;
        }
    }